

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O0

void __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<double,1,2,1,1,2>>::
resizeLike<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,1,2,1,1,2>const,Eigen::Matrix<double,1,2,1,1,2>const>>
          (PlainObjectBase<Eigen::Matrix<double,1,2,1,1,2>> *this,
          EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
          *_other)

{
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  *this_00;
  Index IVar1;
  Index IVar2;
  Index IVar3;
  bool bVar4;
  Index othersize;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  *other;
  EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
  *_other_local;
  PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_> *this_local;
  
  this_00 = EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
            ::derived(_other);
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  ::rows(this_00);
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  ::cols(this_00);
  IVar1 = CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
          ::rows(this_00);
  IVar2 = CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
          ::cols(this_00);
  IVar3 = CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
          ::rows(this_00);
  bVar4 = true;
  if (IVar3 != 1) {
    IVar3 = CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
            ::cols(this_00);
    bVar4 = IVar3 == 1;
  }
  if (!bVar4) {
    __assert_fail("other.rows() == 1 || other.cols() == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/external_libraries/Eigen/src/Core/PlainObjectBase.h"
                  ,0x171,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, 1, 2>>::resizeLike(const EigenBase<OtherDerived> &) [Derived = Eigen::Matrix<double, 1, 2>, OtherDerived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, 1, 2>, const Eigen::Matrix<double, 1, 2>>]"
                 );
  }
  PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_> *)this,1,IVar1 * IVar2);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC 
    EIGEN_STRONG_INLINE void resizeLike(const EigenBase<OtherDerived>& _other)
    {
      const OtherDerived& other = _other.derived();
      internal::check_rows_cols_for_overflow<MaxSizeAtCompileTime>::run(other.rows(), other.cols());
      const Index othersize = other.rows()*other.cols();
      if(RowsAtCompileTime == 1)
      {
        eigen_assert(other.rows() == 1 || other.cols() == 1);
        resize(1, othersize);
      }
      else if(ColsAtCompileTime == 1)
      {
        eigen_assert(other.rows() == 1 || other.cols() == 1);
        resize(othersize, 1);
      }
      else resize(other.rows(), other.cols());
    }